

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::on_trigger_auto_manage(session_impl *this)

{
  session_impl *this_local;
  
  if (((this->m_need_auto_manage & 1U) == 0) || ((this->m_abort & 1U) != 0)) {
    this->m_pending_auto_manage = false;
  }
  else {
    recalculate_auto_managed_torrents(this);
    this->m_pending_auto_manage = false;
  }
  return;
}

Assistant:

void session_impl::on_trigger_auto_manage()
	{
		TORRENT_ASSERT(m_pending_auto_manage);
		if (!m_need_auto_manage || m_abort)
		{
			m_pending_auto_manage = false;
			return;
		}
		// don't clear m_pending_auto_manage until after we've
		// recalculated the auto managed torrents. The auto-managed
		// logic may trigger another auto-managed event otherwise
		recalculate_auto_managed_torrents();
		m_pending_auto_manage = false;
	}